

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DP.c
# Opt level: O2

logical patch_intersect(Integer ilo,Integer ihi,Integer jlo,Integer jhi,Integer *ilop,Integer *ihip,
                       Integer *jlop,Integer *jhip)

{
  long lVar1;
  
  if (jhi < jlo || ihi < ilo) {
    return 0;
  }
  lVar1 = *ilop;
  if (lVar1 <= *ihip) {
    if (((*jlop <= *jhip) && (ilo <= *ihip && lVar1 <= ihi)) && (jlo <= *jhip && *jlop <= jhi)) {
      if (ilo < lVar1) {
        ilo = lVar1;
      }
      *ilop = ilo;
      if (*ihip < ihi) {
        ihi = *ihip;
      }
      *ihip = ihi;
      if (jlo < *jlop) {
        jlo = *jlop;
      }
      *jlop = jlo;
      if (*jhip < jhi) {
        jhi = *jhip;
      }
      *jhip = jhi;
      return 1;
    }
  }
  return 0;
}

Assistant:

static logical patch_intersect(ilo, ihi, jlo, jhi, ilop, ihip, jlop, jhip)
     Integer ilo, ihi, jlo, jhi;
     Integer *ilop, *ihip, *jlop, *jhip;
{
     /* check consistency of patch coordinates */
     if( ihi < ilo || jhi < jlo)     return FALSE; /* inconsistent */
     if( *ihip < *ilop || *jhip < *jlop) return FALSE; /* inconsistent */

     /* find the intersection and update (ilop: ihip, jlop: jhip) */
     if( ihi < *ilop || *ihip < ilo) return FALSE; /* don't intersect */
     if( jhi < *jlop || *jhip < jlo) return FALSE; /* don't intersect */
     *ilop = GA_MAX(ilo,*ilop);
     *ihip = GA_MIN(ihi,*ihip);
     *jlop = GA_MAX(jlo,*jlop);
     *jhip = GA_MIN(jhi,*jhip);

     return TRUE;
}